

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O3

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  uchar *puVar2;
  pointer pppuVar3;
  pointer pppuVar4;
  pointer pppuVar5;
  pointer pppuVar6;
  pointer pppuVar7;
  pointer pppuVar8;
  uint j;
  uint uVar9;
  long lVar10;
  uint uVar11;
  size_t sVar12;
  size_t N_00;
  ulong uVar13;
  ulong uVar14;
  size_t N_01;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t N_02;
  uint j_1;
  uchar **ppuVar18;
  uchar **ppuVar19;
  ulong uVar20;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_int,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_128;
  vector_block<unsigned_char_*,_1024U> local_100;
  vector_block<unsigned_char_*,_1024U> local_d8;
  uint auStack_b0 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_128._left_in_block = 0;
  local_128._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._insertpos = (uchar **)0x0;
  local_128._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100._insertpos = (uchar **)0x0;
  local_100._left_in_block = 0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._index_block.super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._insertpos = (uchar **)0x0;
  local_d8._left_in_block = 0;
  uVar9 = pseudo_median<unsigned_int>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    ppuVar19 = strings;
    do {
      lVar10 = 0;
      do {
        puVar2 = ppuVar19[lVar10];
        if (puVar2 == (uchar *)0x0) goto LAB_002205b7;
        bVar1 = puVar2[depth];
        if (bVar1 == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (uint)bVar1 << 0x18;
          if (puVar2[depth + 1] != 0) {
            uVar11 = (uint)bVar1 << 0x18 | (uint)puVar2[depth + 1] << 0x10;
            if (puVar2[depth + 2] != '\0') {
              uVar11 = uVar11 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
            }
          }
        }
        auStack_b0[lVar10] = uVar11;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      lVar10 = 0;
      ppuVar18 = ppuVar19;
      do {
        uVar11 = auStack_b0[lVar10];
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_128 +
                   (ulong)(uVar11 == uVar9) + (ulong)(uVar9 <= uVar11 && uVar11 != uVar9) * 2,
                   ppuVar18);
        lVar10 = lVar10 + 1;
        ppuVar18 = ppuVar18 + 1;
      } while (lVar10 != 0x20);
      uVar17 = uVar17 + 0x20;
      ppuVar19 = ppuVar19 + 0x20;
    } while (uVar17 < (N & 0xffffffffffffffe0));
  }
  lVar10 = N - uVar17;
  if (uVar17 <= N && lVar10 != 0) {
    ppuVar19 = strings + uVar17;
    do {
      puVar2 = *ppuVar19;
      if (puVar2 == (uchar *)0x0) {
LAB_002205b7:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)puVar2[depth] << 0x18;
        if (puVar2[depth + 1] != 0) {
          uVar11 = uVar11 | (uint)puVar2[depth + 1] << 0x10;
          if (puVar2[depth + 2] != '\0') {
            uVar11 = uVar11 | CONCAT11(puVar2[depth + 2],puVar2[depth + 3]);
          }
        }
      }
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_128 +
                 (ulong)(uVar11 == uVar9) + (ulong)(uVar9 <= uVar11 && uVar11 != uVar9) * 2,ppuVar19
                );
      ppuVar19 = ppuVar19 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  pppuVar8 = local_d8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar7 = local_d8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar6 = local_100._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar5 = local_100._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  pppuVar4 = local_128._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pppuVar3 = local_128._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar17 = (long)local_128._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  N_00 = uVar17 * 0x80 - (ulong)local_128._left_in_block;
  uVar13 = (long)local_100._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar16 = (ulong)local_100._left_in_block;
  N_02 = uVar13 * 0x80 - uVar16;
  uVar14 = (long)local_d8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_d8._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar15 = (ulong)local_d8._left_in_block;
  N_01 = uVar14 * 0x80 - uVar15;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned int]"
                 );
  }
  if (uVar17 * 0x80 != (ulong)local_128._left_in_block) {
    if (local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_002205d6;
    ppuVar19 = strings;
    if (8 < uVar17) {
      uVar20 = 2;
      if (2 < (ulong)((long)uVar17 >> 3)) {
        uVar20 = (long)uVar17 >> 3;
      }
      lVar10 = 0;
      do {
        memmove(ppuVar19,pppuVar3[lVar10],0x2000);
        ppuVar19 = ppuVar19 + 0x400;
        lVar10 = lVar10 + 1;
      } while (uVar20 - 1 != lVar10);
    }
    sVar12 = (long)local_128._insertpos - (long)pppuVar4[-1];
    if (sVar12 != 0) {
      memmove(ppuVar19,pppuVar4[-1],sVar12);
    }
  }
  if (uVar13 * 0x80 != uVar16) {
    if (pppuVar5 == pppuVar6) goto LAB_002205d6;
    ppuVar19 = strings + N_00;
    if (8 < uVar13) {
      uVar17 = 2;
      if (2 < (ulong)((long)uVar13 >> 3)) {
        uVar17 = (long)uVar13 >> 3;
      }
      lVar10 = 0;
      do {
        memmove(ppuVar19,pppuVar5[lVar10],0x2000);
        ppuVar19 = ppuVar19 + 0x400;
        lVar10 = lVar10 + 1;
      } while (uVar17 - 1 != lVar10);
    }
    ppuVar18 = pppuVar6[-1];
    sVar12 = (long)local_100._insertpos - (long)ppuVar18;
    if (sVar12 != 0) {
      memmove(ppuVar19,ppuVar18,sVar12);
    }
  }
  if (uVar14 * 0x80 != uVar15) {
    if (pppuVar7 == pppuVar8) {
LAB_002205d6:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar19 = strings + N_00 + N_02;
    if (8 < uVar14) {
      uVar17 = 2;
      if (2 < (ulong)((long)uVar14 >> 3)) {
        uVar17 = (long)uVar14 >> 3;
      }
      lVar10 = 0;
      do {
        memmove(ppuVar19,pppuVar7[lVar10],0x2000);
        ppuVar19 = ppuVar19 + 0x400;
        lVar10 = lVar10 + 1;
      } while (uVar17 - 1 != lVar10);
    }
    ppuVar18 = pppuVar8[-1];
    sVar12 = (long)local_d8._insertpos - (long)ppuVar18;
    if (sVar12 != 0) {
      memmove(ppuVar19,ppuVar18,sVar12);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_128);
  vector_block<unsigned_char_*,_1024U>::clear(&local_100);
  vector_block<unsigned_char_*,_1024U>::clear(&local_d8);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>(strings,N_00,depth);
  if ((char)uVar9 != '\0') {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>(strings + N_00,N_02,depth + 4)
    ;
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
            (strings + N_00 + N_02,N_01,depth);
  lVar10 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_128._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + -0x28;
  } while (lVar10 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}